

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_lsrkstep_io.c
# Opt level: O2

int LSRKStepSetSSPMethod(void *arkode_mem,ARKODE_LSRKMethodType method)

{
  int iVar1;
  ARKodeHAdaptMem pAVar2;
  int iVar3;
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  
  iVar1 = lsrkStep_AccessARKODEStepMem(arkode_mem,"LSRKStepSetSSPMethod",&ark_mem,&step_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  switch(method) {
  case ARKODE_LSRK_RKC_2:
  case ARKODE_LSRK_RKL_2:
    arkProcessError(ark_mem,-0x16,0x68,"LSRKStepSetSSPMethod",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                    ,"Invalid method option: Call LSRKStepCreateSTS to create an STS method first.")
    ;
    goto LAB_001434d7;
  case ARKODE_LSRK_SSP_S_2:
    ark_mem->step = lsrkStep_TakeStepSSPs2;
    iVar3 = 1;
    step_mem->is_SSP = 1;
    step_mem->req_stages = 10;
    step_mem->nfusedopvecs = 3;
    pAVar2 = ark_mem->hadapt_mem;
    iVar1 = 2;
    break;
  case ARKODE_LSRK_SSP_S_3:
    ark_mem->step = lsrkStep_TakeStepSSPs3;
    step_mem->is_SSP = 1;
    step_mem->req_stages = 9;
    step_mem->nfusedopvecs = 3;
    pAVar2 = ark_mem->hadapt_mem;
    pAVar2->q = 3;
    step_mem->q = 3;
    iVar3 = 2;
    goto LAB_001434d1;
  case ARKODE_LSRK_SSP_10_4:
    ark_mem->step = lsrkStep_TakeStepSSP104;
    step_mem->is_SSP = 1;
    step_mem->req_stages = 10;
    iVar3 = 3;
    step_mem->nfusedopvecs = 3;
    pAVar2 = ark_mem->hadapt_mem;
    iVar1 = 4;
    break;
  default:
    arkProcessError(ark_mem,-0x16,0x85,"LSRKStepSetSSPMethod",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_lsrkstep_io.c"
                    ,"Invalid method option.");
    return -0x16;
  }
  pAVar2->q = iVar1;
  step_mem->q = iVar1;
LAB_001434d1:
  pAVar2->p = iVar3;
  step_mem->p = iVar3;
LAB_001434d7:
  step_mem->LSRKmethod = method;
  return 0;
}

Assistant:

int LSRKStepSetSSPMethod(void* arkode_mem, ARKODE_LSRKMethodType method)
{
  ARKodeMem ark_mem;
  ARKodeLSRKStepMem step_mem;
  int retval;

  /* access ARKodeMem and ARKodeLSRKStepMem structures */
  retval = lsrkStep_AccessARKODEStepMem(arkode_mem, __func__, &ark_mem,
                                        &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  switch (method)
  {
  case ARKODE_LSRK_RKC_2:
  case ARKODE_LSRK_RKL_2:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "Invalid method option: Call LSRKStepCreateSTS to create an STS method first.");
    break;
  case ARKODE_LSRK_SSP_S_2:
    ark_mem->step          = lsrkStep_TakeStepSSPs2;
    step_mem->is_SSP       = SUNTRUE;
    step_mem->req_stages   = 10;
    step_mem->nfusedopvecs = 3;
    step_mem->q = ark_mem->hadapt_mem->q = 2;
    step_mem->p = ark_mem->hadapt_mem->p = 1;
    break;
  case ARKODE_LSRK_SSP_S_3:
    ark_mem->step          = lsrkStep_TakeStepSSPs3;
    step_mem->is_SSP       = SUNTRUE;
    step_mem->req_stages   = 9;
    step_mem->nfusedopvecs = 3;
    step_mem->q = ark_mem->hadapt_mem->q = 3;
    step_mem->p = ark_mem->hadapt_mem->p = 2;
    break;
  case ARKODE_LSRK_SSP_10_4:
    ark_mem->step          = lsrkStep_TakeStepSSP104;
    step_mem->is_SSP       = SUNTRUE;
    step_mem->req_stages   = 10;
    step_mem->nfusedopvecs = 3;
    step_mem->q = ark_mem->hadapt_mem->q = 4;
    step_mem->p = ark_mem->hadapt_mem->p = 3;
    break;

  default:
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid method option.");
    return ARK_ILL_INPUT;
  }

  step_mem->LSRKmethod = method;

  return ARK_SUCCESS;
}